

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

Vec_Ptr_t * Dar_BalanceCone(Aig_Obj_t *pObj,Vec_Vec_t *vStore,int Level)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vNodes;
  int Level_local;
  Vec_Vec_t *vStore_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                  ,0x7a,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 != 0) {
    iVar1 = Vec_VecSize(vStore);
    if (iVar1 <= Level) {
      Vec_VecPush(vStore,Level,(void *)0x0);
    }
    p = Vec_VecEntry(vStore,Level);
    Vec_PtrClear(p);
    Dar_BalanceCone_rec(pObj,pObj,p);
    iVar1 = Aig_ObjIsExor(pObj);
    Dar_BalanceUniqify(pObj,p,iVar1);
    return p;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darBalance.c"
                ,0x7b,"Vec_Ptr_t *Dar_BalanceCone(Aig_Obj_t *, Vec_Vec_t *, int)");
}

Assistant:

Vec_Ptr_t * Dar_BalanceCone( Aig_Obj_t * pObj, Vec_Vec_t * vStore, int Level )
{
    Vec_Ptr_t * vNodes;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    // extend the storage
    if ( Vec_VecSize( vStore ) <= Level )
        Vec_VecPush( vStore, Level, 0 );
    // get the temporary array of nodes
    vNodes = Vec_VecEntry( vStore, Level );
    Vec_PtrClear( vNodes );
    // collect the nodes in the implication supergate
    Dar_BalanceCone_rec( pObj, pObj, vNodes );
    // remove duplicates
    Dar_BalanceUniqify( pObj, vNodes, Aig_ObjIsExor(pObj) );
    return vNodes;
}